

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagsValidator_FlagSaver::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSaver fs_1;
  FlagSaver fs;
  string local_38;
  
  FlagSaver::FlagSaver(&fs);
  pcVar2 = "FlagSaver";
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator");
  FlagSaver::FlagSaver(&fs_1);
  bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
  if (bVar1) {
    SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x14d2d0,"50",pcVar2);
    bVar1 = std::operator==("",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      FlagSaver::~FlagSaver(&fs_1);
      SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x14d2d0,"50",pcVar2);
      bVar1 = std::operator!=("",&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1) {
        bVar1 = RegisterFlagValidator
                          (&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
        if (!bVar1) goto LAB_0013aacf;
        FlagSaver::FlagSaver(&fs_1);
        bVar1 = RegisterFlagValidator
                          (&(anonymous_namespace)::fLI::FLAGS_test_flag,
                           (_func_bool_char_ptr_int32 *)0x0);
        if (!bVar1) {
          pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, NULL)";
          goto LAB_0013ab35;
        }
        SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x14d2d0,"50",pcVar2);
        bVar1 = std::operator!=("",&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (bVar1) {
          FlagSaver::~FlagSaver(&fs_1);
          SetCommandLineOption_abi_cxx11_(&local_38,(gflags *)0x14d2d0,"50",pcVar2);
          bVar1 = std::operator==("",&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          if (bVar1) {
            FlagSaver::~FlagSaver(&fs);
            return;
          }
          goto LAB_0013aafc;
        }
      }
      pcVar2 = "!=";
    }
    else {
LAB_0013aafc:
      pcVar2 = "==";
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","\"\"",pcVar2,
            "SetCommandLineOption(\"test_flag\", \"50\")");
  }
  else {
LAB_0013aacf:
    pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5)";
LAB_0013ab35:
    fprintf(_stderr,"Check failed: %s\n",pcVar2);
  }
  exit(1);
}

Assistant:

TEST(FlagsValidator, FlagSaver) {
  {
    FlagSaver fs;
    EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
    EXPECT_EQ("", SetCommandLineOption("test_flag", "50"));  // fails validation
  }
  EXPECT_NE("", SetCommandLineOption("test_flag", "50"));  // validator is gone

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  {
    FlagSaver fs;
    EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
    EXPECT_NE("", SetCommandLineOption("test_flag", "50"));  // no validator
  }
  EXPECT_EQ("", SetCommandLineOption("test_flag", "50"));  // validator is back
}